

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

const_iterator __thiscall QUrlQueryPrivate::findKey(QUrlQueryPrivate *this,QString *key)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  pair<QString,_QString> *ppVar4;
  int iVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QStringView in;
  QString local_68;
  QString local_48;
  undefined4 local_30;
  undefined4 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ppVar4 = (this->itemList).d.ptr;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)0x0;
  local_48.d.size = 0;
  uVar1 = this->valueDelimiter;
  uVar2 = this->pairDelimiter;
  uVar3 = *(undefined4 *)&this->field_0x24;
  auVar7._4_4_ = uVar3;
  auVar7._2_2_ = uVar2;
  auVar7._0_2_ = uVar1;
  auVar7._8_8_ = 0;
  auVar7 = pshuflw(auVar7,auVar7,0xe1);
  local_30 = auVar7._0_4_;
  local_2c = 0x23;
  in.m_data = (key->d).ptr;
  in.m_size = (key->d).size;
  qVar6 = qt_urlRecode(&local_48,in,(ComponentFormattingOptions)0x2000000,(ushort *)&local_30);
  local_68.d.size = local_48.d.size;
  local_68.d.ptr = local_48.d.ptr;
  local_68.d.d = local_48.d.d;
  if (qVar6 == 0) {
    local_68.d.d = (key->d).d;
    local_68.d.ptr = (key->d).ptr;
    local_68.d.size = (key->d).size;
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.size = 0;
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar5 = findRecodedKey(this,&local_68,0);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (const_iterator)(ppVar4 + iVar5);
  }
  __stack_chk_fail();
}

Assistant:

Map::const_iterator findKey(const QString &key) const
    { return itemList.constBegin() + findRecodedKey(recodeFromUser(key)); }